

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderInvarianceTests.cpp
# Opt level: O0

Vec4 __thiscall
deqp::gles2::Functional::anon_unknown_1::genRandomVector(anon_unknown_1 *this,Random *rnd)

{
  float *pfVar1;
  float fVar2;
  undefined8 uVar3;
  Vec4 VVar4;
  Random *rnd_local;
  Vec4 *retVal;
  
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)this);
  fVar2 = de::Random::getFloat(rnd,-1.0,1.0);
  pfVar1 = tcu::Vector<float,_4>::x((Vector<float,_4> *)this);
  *pfVar1 = fVar2;
  fVar2 = de::Random::getFloat(rnd,-1.0,1.0);
  pfVar1 = tcu::Vector<float,_4>::y((Vector<float,_4> *)this);
  *pfVar1 = fVar2;
  fVar2 = de::Random::getFloat(rnd,-1.0,1.0);
  pfVar1 = tcu::Vector<float,_4>::z((Vector<float,_4> *)this);
  *pfVar1 = fVar2;
  uVar3 = 0x3f800000;
  VVar4.m_data[0] = de::Random::getFloat(rnd,0.2,1.0);
  pfVar1 = tcu::Vector<float,_4>::w((Vector<float,_4> *)this);
  VVar4.m_data[1] = 0.0;
  *pfVar1 = VVar4.m_data[0];
  VVar4.m_data[2] = (float)(int)uVar3;
  VVar4.m_data[3] = (float)(int)((ulong)uVar3 >> 0x20);
  return (Vec4)VVar4.m_data;
}

Assistant:

static tcu::Vec4 genRandomVector (de::Random& rnd)
{
	tcu::Vec4 retVal;

	retVal.x() = rnd.getFloat(-1.0f, 1.0f);
	retVal.y() = rnd.getFloat(-1.0f, 1.0f);
	retVal.z() = rnd.getFloat(-1.0f, 1.0f);
	retVal.w() = rnd.getFloat( 0.2f, 1.0f);

	return retVal;
}